

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

bool duckdb::VectorCastHelpers::ToDecimalCast<unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  InternalException *this;
  uint8_t uVar2;
  string local_50;
  
  uVar2 = DecimalType::GetWidth(&result->type);
  local_50.field_2._M_local_buf[9] = DecimalType::GetScale(&result->type);
  PVar1 = (result->type).physical_type_;
  local_50._M_dataplus._M_p = (pointer)result;
  local_50._M_string_length = (size_type)parameters;
  local_50.field_2._M_local_buf[8] = uVar2;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      local_50.field_2._M_local_buf[0] = '\x01';
      UnaryExecutor::
      ExecuteStandard<unsigned_char,short,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
                (source,result,count,&local_50,parameters->error_message != (string *)0x0,
                 CAN_THROW_RUNTIME_ERROR);
    }
    else {
      if (PVar1 != INT32) {
LAB_00f8c511:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unimplemented internal type for decimal","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50.field_2._M_local_buf[0] = '\x01';
      UnaryExecutor::
      ExecuteStandard<unsigned_char,int,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
                (source,result,count,&local_50,parameters->error_message != (string *)0x0,
                 CAN_THROW_RUNTIME_ERROR);
    }
  }
  else if (PVar1 == INT64) {
    local_50.field_2._M_local_buf[0] = '\x01';
    UnaryExecutor::
    ExecuteStandard<unsigned_char,long,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
              (source,result,count,&local_50,parameters->error_message != (string *)0x0,
               CAN_THROW_RUNTIME_ERROR);
  }
  else {
    if (PVar1 != INT128) goto LAB_00f8c511;
    local_50.field_2._M_local_buf[0] = '\x01';
    UnaryExecutor::
    ExecuteStandard<unsigned_char,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
              (source,result,count,&local_50,parameters->error_message != (string *)0x0,
               CAN_THROW_RUNTIME_ERROR);
  }
  return (bool)local_50.field_2._M_local_buf[0];
}

Assistant:

static bool ToDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		auto &result_type = result.GetType();
		auto width = DecimalType::GetWidth(result_type);
		auto scale = DecimalType::GetScale(result_type);
		switch (result_type.InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalCast<T, int16_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT32:
			return TemplatedDecimalCast<T, int32_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT64:
			return TemplatedDecimalCast<T, int64_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT128:
			return TemplatedDecimalCast<T, hugeint_t, TryCastToDecimal>(source, result, count, parameters, width,
			                                                            scale);
		default:
			throw InternalException("Unimplemented internal type for decimal");
		}
	}